

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O0

void telnet_negotiate(telnet_t *telnet,uchar cmd,uchar telopt)

{
  byte bVar1;
  undefined8 in_RCX;
  undefined1 local_17;
  uchar local_16;
  uchar local_15;
  telnet_rfc1143_t local_14;
  uchar local_12;
  uchar local_11;
  uchar bytes [3];
  telnet_rfc1143_t q;
  uchar telopt_local;
  telnet_t *ptStack_10;
  uchar cmd_local;
  telnet_t *telnet_local;
  
  local_12 = telopt;
  local_11 = cmd;
  ptStack_10 = telnet;
  if ((telnet->flags & 1) == 0) {
    local_14 = _get_rfc1143(telnet,telopt);
    switch(local_11) {
    case 0xfb:
      if (((ushort)local_14 & 0xf00) == 0) {
        _set_rfc1143(ptStack_10,local_12,'\x03',(char)((int)(local_14.state & 0xf0) >> 4));
        _send_negotiate(ptStack_10,0xfb,local_12);
      }
      else if ((local_14.state & 0xf) == 2) {
        _set_rfc1143(ptStack_10,local_12,'\x04',(char)((int)(local_14.state & 0xf0) >> 4));
      }
      else if ((local_14.state & 0xf) == 5) {
        _set_rfc1143(ptStack_10,local_12,'\x03',(char)((int)(local_14.state & 0xf0) >> 4));
      }
      break;
    case 0xfc:
      bVar1 = local_14.state & 0xf;
      if (bVar1 == 1) {
        _set_rfc1143(ptStack_10,local_12,'\x02',(char)((int)(local_14.state & 0xf0) >> 4));
        _send_negotiate(ptStack_10,0xfc,local_12);
      }
      else if (bVar1 == 3) {
        _set_rfc1143(ptStack_10,local_12,'\x05',(char)((int)(local_14.state & 0xf0) >> 4));
      }
      else if (bVar1 == 4) {
        _set_rfc1143(ptStack_10,local_12,'\x02',(char)((int)(local_14.state & 0xf0) >> 4));
      }
      break;
    case 0xfd:
      bVar1 = local_14.state >> 4;
      if (bVar1 == 0) {
        _set_rfc1143(ptStack_10,local_12,local_14.state & 0xf,'\x03');
        _send_negotiate(ptStack_10,0xfd,local_12);
      }
      else if (bVar1 == 2) {
        _set_rfc1143(ptStack_10,local_12,local_14.state & 0xf,'\x04');
      }
      else if (bVar1 == 5) {
        _set_rfc1143(ptStack_10,local_12,local_14.state & 0xf,'\x03');
      }
      break;
    case 0xfe:
      bVar1 = local_14.state >> 4;
      if (bVar1 == 1) {
        _set_rfc1143(ptStack_10,local_12,local_14.state & 0xf,'\x02');
        _send_negotiate(ptStack_10,0xfe,local_12);
      }
      else if (bVar1 == 3) {
        _set_rfc1143(ptStack_10,local_12,local_14.state & 0xf,'\x05');
      }
      else if (bVar1 == 4) {
        _set_rfc1143(ptStack_10,local_12,local_14.state & 0xf,'\x02');
      }
    }
  }
  else {
    local_17 = 0xff;
    local_16 = cmd;
    local_15 = telopt;
    _send((int)telnet,&local_17,3,(int)CONCAT71((int7)((ulong)in_RCX >> 8),cmd));
  }
  return;
}

Assistant:

void telnet_negotiate(telnet_t *telnet, unsigned char cmd,
		unsigned char telopt) {
	telnet_rfc1143_t q;

	/* if we're in proxy mode, just send it now */
	if (telnet->flags & TELNET_FLAG_PROXY) {
		unsigned char bytes[3];
		bytes[0] = TELNET_IAC;
		bytes[1] = cmd;
		bytes[2] = telopt;
		_sendu(telnet, bytes, 3);
		return;
	}

	/* get current option states */
	q = _get_rfc1143(telnet, telopt);

	switch (cmd) {
	/* advertise willingess to support an option */
	case TELNET_WILL:
		switch (Q_US(q)) {
		case Q_NO:
			_set_rfc1143(telnet, telopt, Q_WANTYES, Q_HIM(q));
			_send_negotiate(telnet, TELNET_WILL, telopt);
			break;
		case Q_WANTNO:
			_set_rfc1143(telnet, telopt, Q_WANTNO_OP, Q_HIM(q));
			break;
		case Q_WANTYES_OP:
			_set_rfc1143(telnet, telopt, Q_WANTYES, Q_HIM(q));
			break;
		}
		break;

	/* force turn-off of locally enabled option */
	case TELNET_WONT:
		switch (Q_US(q)) {
		case Q_YES:
			_set_rfc1143(telnet, telopt, Q_WANTNO, Q_HIM(q));
			_send_negotiate(telnet, TELNET_WONT, telopt);
			break;
		case Q_WANTYES:
			_set_rfc1143(telnet, telopt, Q_WANTYES_OP, Q_HIM(q));
			break;
		case Q_WANTNO_OP:
			_set_rfc1143(telnet, telopt, Q_WANTNO, Q_HIM(q));
			break;
		}
		break;

	/* ask remote end to enable an option */
	case TELNET_DO:
		switch (Q_HIM(q)) {
		case Q_NO:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES);
			_send_negotiate(telnet, TELNET_DO, telopt);
			break;
		case Q_WANTNO:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO_OP);
			break;
		case Q_WANTYES_OP:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES);
			break;
		}
		break;

	/* demand remote end disable an option */
	case TELNET_DONT:
		switch (Q_HIM(q)) {
		case Q_YES:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO);
			_send_negotiate(telnet, TELNET_DONT, telopt);
			break;
		case Q_WANTYES:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES_OP);
			break;
		case Q_WANTNO_OP:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO);
			break;
		}
		break;
	}
}